

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O3

int nsync_mu_semaphore_p_with_deadline(nsync_semaphore *s,nsync_time abs_deadline)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  __time_t *p_Var4;
  bool bVar5;
  nsync_time nVar6;
  __time_t local_40;
  __syscall_slong_t local_38;
  
  do {
    while (iVar1 = *(int *)s->sem_space, iVar1 == 0) {
      nVar6.tv_nsec = 999999999;
      nVar6.tv_sec = 0x7fffffffffffffff;
      iVar1 = nsync_time_cmp(abs_deadline,nVar6);
      if (iVar1 == 0) {
        p_Var4 = (__time_t *)0x0;
      }
      else {
        p_Var4 = &local_40;
        local_40 = abs_deadline.tv_sec;
        local_38 = abs_deadline.tv_nsec;
      }
      lVar2 = syscall(0xca,s,0x189,0,p_Var4,0,0xffffffff);
      if ((int)lVar2 != 0) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        if (((iVar1 == 4) || (iVar1 == 0xb)) || (iVar1 == 0x6e)) {
          if (iVar1 == 0x6e && (int)lVar2 == -1) {
            nVar6 = nsync_time_now();
            iVar1 = nsync_time_cmp(abs_deadline,nVar6);
            if (iVar1 < 1) {
              return 0x6e;
            }
          }
        }
        else {
          _DAT_00000000 = 0;
        }
      }
    }
    LOCK();
    bVar5 = iVar1 == *(int *)s->sem_space;
    if (bVar5) {
      *(int *)s->sem_space = iVar1 + -1;
    }
    UNLOCK();
  } while (!bVar5);
  return 0;
}

Assistant:

int nsync_mu_semaphore_p_with_deadline (nsync_semaphore *s, nsync_time abs_deadline) {
	struct futex *f = (struct futex *)s;
	int i;
	int result = 0;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
			int futex_result;
			struct timespec ts_buf;
			const struct timespec *ts = NULL;
			if (nsync_time_cmp (abs_deadline, nsync_time_no_deadline) != 0) {
				memset (&ts_buf, 0, sizeof (ts_buf));
				if (FUTEX_TIMEOUT_IS_ABSOLUTE) {
					ts_buf.tv_sec = NSYNC_TIME_SEC (abs_deadline);
					ts_buf.tv_nsec = NSYNC_TIME_NSEC (abs_deadline);
				} else {
					nsync_time now;
					now = nsync_time_now ();
					if (nsync_time_cmp (now, abs_deadline) > 0) {
						ts_buf.tv_sec = 0;
						ts_buf.tv_nsec = 0;
					} else {
						nsync_time rel_deadline;
						rel_deadline = nsync_time_sub (abs_deadline, now);
						ts_buf.tv_sec = NSYNC_TIME_SEC (rel_deadline);
						ts_buf.tv_nsec = NSYNC_TIME_NSEC (rel_deadline);
					}
				}
				ts = &ts_buf;
			}
			futex_result = futex (&f->i, FUTEX_WAIT_, i, ts, NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR || errno == EWOULDBLOCK ||
				errno == ETIMEDOUT);
			/* Some systems don't wait as long as they are told. */ 
			if (futex_result == -1 && errno == ETIMEDOUT &&
			    nsync_time_cmp (abs_deadline, nsync_time_now ()) <= 0) {
				result = ETIMEDOUT;
			}
		}
	} while (result == 0 && (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i - 1)));
	return (result);
}